

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmDefinitions::ClosureKeys_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmDefinitions *this,StackIter begin,StackIter end)

{
  pointer pbVar1;
  pointer pbVar2;
  iterator other;
  bool bVar3;
  PointerType pcVar4;
  string *__x;
  _Hash_node_base *p_Var5;
  pair<std::__detail::_Node_iterator<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>,_bool>
  pVar6;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  bound;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_78;
  iterator local_40;
  
  local_40.Position = (PositionType)begin.Tree;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_buckets = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  local_40.Tree = (cmLinkedTree<cmDefinitions> *)this;
  while( true ) {
    other.Position = (PositionType)end.Tree;
    other.Tree = (cmLinkedTree<cmDefinitions> *)begin.Position;
    bVar3 = cmLinkedTree<cmDefinitions>::iterator::operator!=(&local_40,other);
    if (!bVar3) break;
    pbVar1 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,
              ((long)pbVar2 - (long)pbVar1 >> 5) + (pcVar4->Map)._M_h._M_element_count);
    pcVar4 = cmLinkedTree<cmDefinitions>::iterator::operator->(&local_40);
    for (p_Var5 = (pcVar4->Map)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
        p_Var5 = p_Var5->_M_nxt) {
      local_88 = *(undefined4 *)&p_Var5[3]._M_nxt;
      uStack_84 = *(undefined4 *)((long)&p_Var5[3]._M_nxt + 4);
      uStack_80 = *(undefined4 *)&p_Var5[4]._M_nxt;
      uStack_7c = *(undefined4 *)((long)&p_Var5[4]._M_nxt + 4);
      pVar6 = std::
              _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<std::basic_string_view<char,std::char_traits<char>>>
                        ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&local_78,&local_88);
      if ((((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (p_Var5[8]._M_nxt != (_Hash_node_base *)0x0)) {
        __x = ::cm::String::str_if_stable_abi_cxx11_((String *)(p_Var5 + 1));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,__x);
      }
    }
    cmLinkedTree<cmDefinitions>::iterator::operator++(&local_40);
  }
  std::
  _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmDefinitions::ClosureKeys(StackIter begin,
                                                    StackIter end)
{
  std::vector<std::string> defined;
  std::unordered_set<cm::string_view> bound;

  for (StackIter it = begin; it != end; ++it) {
    defined.reserve(defined.size() + it->Map.size());
    for (auto const& mi : it->Map) {
      // Use this key if it is not already set or unset.
      if (bound.emplace(mi.first.view()).second && mi.second.Value) {
        defined.push_back(*mi.first.str_if_stable());
      }
    }
  }

  return defined;
}